

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

ArchKind __thiscall llvm::AArch64::parseCPUArch(AArch64 *this,StringRef CPU)

{
  ArchKind AVar1;
  char *__n;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0x10;
  while( true ) {
    __n = *(char **)((long)&PTR_anon_var_dwarf_324c75_001d91c8 + lVar3);
    AVar1 = *(ArchKind *)((long)&(anonymous_namespace)::AArch64CPUNames + lVar3);
    if (__n == CPU.Data) {
      if (__n == (char *)0x0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(this,*(void **)((long)&PTR_anon_var_dwarf_317903_001d91c0 + lVar3),(size_t)__n)
        ;
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) break;
    lVar3 = lVar3 + 0x20;
    if (lVar3 == 0x2b0) {
      return INVALID;
    }
  }
  return AVar1;
}

Assistant:

AArch64::ArchKind llvm::AArch64::parseCPUArch(StringRef CPU) {
  for (const auto C : AArch64CPUNames) {
    if (CPU == C.getName())
      return C.ArchID;
  }
  return ArchKind::INVALID;
}